

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int *piVar7;
  Layer *pLVar8;
  void *pvVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  _func_int **pp_Var16;
  int iVar17;
  int iVar18;
  _func_int *p_Var19;
  uint _elempack;
  Option *opt_00;
  uint _w;
  int iVar20;
  int iVar21;
  uint _elempack_00;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  size_t _elemsize;
  int iVar25;
  uint uVar26;
  void *pvVar27;
  bool bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  float fVar31;
  float fVar35;
  float fVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar37;
  float fVar44;
  float fVar45;
  undefined1 auVar38 [16];
  float fVar46;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_248;
  ulong local_210;
  Mat local_1f8;
  Mat local_1a8;
  int local_15c;
  Mat local_158;
  void *local_108;
  int *local_100;
  ulong local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  _func_int ***local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  p_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0x10c + (long)p_Var19) != 0)) {
    iVar13 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar13;
  }
  uVar15 = bottom_blob->c;
  uVar24 = bottom_blob->elemsize;
  iVar13 = bottom_blob->elempack;
  opt_00 = (Option *)(long)iVar13;
  iVar18 = *(int *)(&this->field_0xd4 + (long)p_Var19);
  iVar25 = *(int *)(&this->field_0xdc + (long)p_Var19);
  iVar17 = *(int *)(&this->field_0xd8 + (long)p_Var19);
  iVar6 = *(int *)(&this->field_0xe0 + (long)p_Var19);
  local_1a8.cstep = 0;
  local_1a8.data = (Allocator *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1a8.elempack = 0;
  local_1a8.h = 0;
  local_1a8.allocator = (Allocator *)local_1a8.data;
  local_1a8.dims = (int)local_1a8.refcount;
  local_1a8.w = local_1a8.refcount._4_4_;
  local_1a8.d = (int)local_1a8.refcount;
  local_1a8.c = local_1a8.elempack;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)p_Var19),bottom_blob,
             &local_1a8,opt);
  iVar12 = local_1a8.w;
  iVar14 = -100;
  if (((Allocator *)local_1a8.data == (Allocator *)0x0) ||
     ((long)local_1a8.c * local_1a8.cstep == 0)) goto LAB_003eb835;
  p_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar18 = (~((iVar18 + -1) * iVar25) + local_1a8.w) / *(int *)(&this->field_0xe4 + (long)p_Var19);
  _w = iVar18 + 1;
  iVar25 = (~((iVar17 + -1) * iVar6) + local_1a8.h) / *(int *)(&this->field_0xe8 + (long)p_Var19);
  uVar26 = *(uint *)(&this->field_0xd0 + (long)p_Var19);
  uVar22 = 1;
  if (opt->use_packing_layout == true) {
    uVar22 = 8;
    if ((uVar26 & 7) != 0) {
      uVar22 = (ulong)((uVar26 & 3) == 0) * 3 + 1;
    }
  }
  _elempack_00 = (uint)uVar22;
  _elemsize = (uVar24 / (ulong)opt_00) * uVar22;
  Mat::create(top_blob,_w,iVar25 + 1,(int)uVar26 / (int)_elempack_00,_elemsize,_elempack_00,
              opt->blob_allocator);
  iVar14 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003eb835;
  iVar14 = iVar13 * uVar15;
  p_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar17 = *(int *)(&this->field_0xd0 + (long)p_Var19);
  iVar6 = *(int *)(&this->field_0x108 + (long)p_Var19);
  if ((iVar14 == iVar6) && (iVar14 == iVar17)) {
    iVar17 = iVar14;
    if (iVar13 == 1) {
      if ((*(int *)(&this->field_0xd4 + (long)p_Var19) != 3) ||
         (*(int *)(&this->field_0xd8 + (long)p_Var19) != 3)) goto LAB_003ea7b2;
      if ((*(int *)(&this->field_0xdc + (long)p_Var19) == 1) &&
         (((*(int *)(&this->field_0xe0 + (long)p_Var19) == 1 &&
           (*(int *)(&this->field_0xe4 + (long)p_Var19) == 1)) &&
          (*(int *)(&this->field_0xe8 + (long)p_Var19) == 1)))) {
        convdw3x3s1_sse(&local_1a8,top_blob,(Mat *)(this->weight_data_tm).data,
                        *(Mat **)(&this->field_0x1b0 + (long)p_Var19),opt_00);
      }
      else {
        if ((((*(int *)(&this->field_0xdc + (long)p_Var19) != 1) ||
             (*(int *)(&this->field_0xe0 + (long)p_Var19) != 1)) ||
            (*(int *)(&this->field_0xe4 + (long)p_Var19) != 2)) ||
           (*(int *)(&this->field_0xe8 + (long)p_Var19) != 2)) goto LAB_003ea7b2;
        convdw3x3s2_sse(&local_1a8,top_blob,(Mat *)(this->weight_data_tm).data,
                        *(Mat **)(&this->field_0x1b0 + (long)p_Var19),opt_00);
      }
LAB_003eb4b0:
      pLVar8 = this->activation;
      if (pLVar8 != (Layer *)0x0) {
        (*pLVar8->_vptr_Layer[9])(pLVar8,top_blob,opt);
      }
    }
    else {
      if (iVar13 == 4) {
        iVar13 = *(int *)(&this->field_0xd4 + (long)p_Var19);
        iVar17 = *(int *)(&this->field_0xd8 + (long)p_Var19);
        if (iVar13 == 5) {
          if (iVar17 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var19) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var19) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var19) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var19) == 1)))) {
              convdw5x5s1_pack4_sse
                        (&local_1a8,top_blob,&this->weight_data_tm,
                         *(Mat **)(&this->field_0x1b0 + (long)p_Var19),opt_00);
            }
            else {
              iVar17 = 5;
              if ((((*(int *)(&this->field_0xdc + (long)p_Var19) != 1) ||
                   (*(int *)(&this->field_0xe0 + (long)p_Var19) != 1)) ||
                  (*(int *)(&this->field_0xe4 + (long)p_Var19) != 2)) ||
                 (*(int *)(&this->field_0xe8 + (long)p_Var19) != 2)) goto LAB_003ead32;
              convdw5x5s2_pack4_sse
                        (&local_1a8,top_blob,&this->weight_data_tm,
                         *(Mat **)(&this->field_0x1b0 + (long)p_Var19),opt_00);
            }
            goto LAB_003eb4b0;
          }
        }
        else if ((iVar13 == 3) && (iVar17 == 3)) {
          if (((*(int *)(&this->field_0xdc + (long)p_Var19) == 1) &&
              ((*(int *)(&this->field_0xe0 + (long)p_Var19) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var19) == 1)))) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var19) == 1)) {
            convdw3x3s1_pack4_sse
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var19),opt_00);
          }
          else {
            iVar17 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var19) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var19) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var19) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var19) != 2)) goto LAB_003ead32;
            convdw3x3s2_pack4_sse
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var19),opt_00);
          }
          goto LAB_003eb4b0;
        }
LAB_003ead32:
        uVar26 = iVar17 * iVar13;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar26,
                   (allocator_type *)&local_1f8);
        pp_Var16 = this->_vptr_ConvolutionDepthWise_x86_avx;
        p_Var19 = pp_Var16[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var19)) {
          iVar13 = *(int *)(&this->field_0xe0 + (long)p_Var19);
          iVar17 = *(int *)(&this->field_0xdc + (long)p_Var19);
          iVar6 = *(int *)(&this->field_0xd4 + (long)p_Var19);
          iVar14 = 0;
          iVar20 = 0;
          iVar21 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var19)) {
              lVar23 = 0;
              do {
                *(int *)((long)(_func_int ***)local_158.data + lVar23 * 4 + (long)iVar21 * 4) =
                     iVar20;
                p_Var19 = pp_Var16[-3];
                iVar20 = iVar20 + *(int *)(&this->field_0xdc + (long)p_Var19);
                lVar23 = lVar23 + 1;
              } while ((int)lVar23 < *(int *)(&this->field_0xd4 + (long)p_Var19));
              iVar21 = iVar21 + (int)lVar23;
            }
            iVar20 = iVar20 + (iVar12 * iVar13 - iVar17 * iVar6);
            iVar14 = iVar14 + 1;
          } while (iVar14 < *(int *)(&this->field_0xd8 + (long)p_Var19));
        }
        if (0 < (int)uVar15) {
          local_15c = uVar26 * 4;
          iVar13 = 0;
          auVar30 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
          auVar57._8_4_ = 0x3f800000;
          auVar57._0_8_ = 0x3f8000003f800000;
          auVar57._12_4_ = 0x3f800000;
          local_210 = 0;
          do {
            if (-1 < iVar25) {
              pvVar27 = (void *)(top_blob->cstep * local_210 * top_blob->elemsize +
                                (long)top_blob->data);
              pp_Var16 = this->_vptr_ConvolutionDepthWise_x86_avx;
              pvVar9 = (this->weight_data_tm).data;
              iVar17 = 0;
              do {
                if (-1 < iVar18) {
                  uVar24 = 0;
                  do {
                    p_Var19 = pp_Var16[-3];
                    if (*(int *)(&this->field_0x100 + (long)p_Var19) == 0) {
                      auVar66 = ZEXT816(0) << 0x40;
                    }
                    else {
                      auVar66 = *(undefined1 (*) [16])
                                 (*(long *)(&this->field_0x1b0 + (long)p_Var19) + local_210 * 0x10);
                    }
                    if (0 < (int)uVar26) {
                      lVar23 = 0;
                      auVar59 = auVar66;
                      do {
                        pfVar2 = (float *)((long)pvVar9 + lVar23 * 4 + (long)iVar13 * 4);
                        pfVar1 = (float *)((long)&((Allocator *)
                                                  ((long)local_1a8.data +
                                                  (long)*(int *)((long)(_func_int ***)local_158.data
                                                                + lVar23) * 2 * 8))->_vptr_Allocator
                                          + (long)(*(int *)(&this->field_0xe4 + (long)p_Var19) *
                                                   (int)uVar24 * 4) * 4 +
                                            (long)*(int *)(&this->field_0xe8 + (long)p_Var19) *
                                            (long)iVar17 * (long)local_1a8.w * local_1a8.elemsize +
                                            local_1a8.cstep * local_210 * local_1a8.elemsize);
                        auVar66._0_4_ = *pfVar2 * *pfVar1 + auVar59._0_4_;
                        auVar66._4_4_ = pfVar2[1] * pfVar1[1] + auVar59._4_4_;
                        auVar66._8_4_ = pfVar2[2] * pfVar1[2] + auVar59._8_4_;
                        auVar66._12_4_ = pfVar2[3] * pfVar1[3] + auVar59._12_4_;
                        lVar23 = lVar23 + 4;
                        auVar59 = auVar66;
                      } while ((ulong)uVar26 << 2 != lVar23);
                    }
                    fVar4 = auVar30._0_4_;
                    fVar5 = auVar30._4_4_;
                    fVar10 = auVar30._8_4_;
                    fVar11 = auVar30._12_4_;
                    fVar31 = auVar66._4_4_;
                    fVar35 = auVar66._8_4_;
                    fVar36 = auVar66._12_4_;
                    switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var19)) {
                    case 1:
                      auVar66 = vmaxps_avx(auVar66,_DAT_00554090);
                      break;
                    case 2:
                      auVar59 = vmaxps_avx(auVar66,ZEXT816(0) << 0x40);
                      auVar69 = vminps_avx(auVar66,ZEXT816(0) << 0x40);
                      fVar4 = **(float **)(&this->field_0x118 + (long)p_Var19);
                      auVar66._0_4_ = fVar4 * auVar69._0_4_ + auVar59._0_4_;
                      auVar66._4_4_ = fVar4 * auVar69._4_4_ + auVar59._4_4_;
                      auVar66._8_4_ = fVar4 * auVar69._8_4_ + auVar59._8_4_;
                      auVar66._12_4_ = fVar4 * auVar69._12_4_ + auVar59._12_4_;
                      break;
                    case 3:
                      uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                      auVar63._4_4_ = uVar3;
                      auVar63._0_4_ = uVar3;
                      auVar63._8_4_ = uVar3;
                      auVar63._12_4_ = uVar3;
                      uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                      auVar72._4_4_ = uVar3;
                      auVar72._0_4_ = uVar3;
                      auVar72._8_4_ = uVar3;
                      auVar72._12_4_ = uVar3;
                      auVar66 = vmaxps_avx(auVar66,auVar63);
                      auVar66 = vminps_avx(auVar72,auVar66);
                      break;
                    case 4:
                      auVar32._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
                      auVar32._8_4_ = -fVar35;
                      auVar32._12_4_ = -fVar36;
                      auVar42._8_4_ = 0x42b0c0a5;
                      auVar42._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar42._12_4_ = 0x42b0c0a5;
                      auVar66 = vminps_avx(auVar32,auVar42);
                      auVar43._8_4_ = 0xc2b0c0a5;
                      auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar43._12_4_ = 0xc2b0c0a5;
                      auVar69 = vmaxps_avx(auVar66,auVar43);
                      auVar64._0_4_ = fVar4 + auVar69._0_4_ * 1.442695;
                      auVar64._4_4_ = fVar5 + auVar69._4_4_ * 1.442695;
                      auVar64._8_4_ = fVar10 + auVar69._8_4_ * 1.442695;
                      auVar64._12_4_ = fVar11 + auVar69._12_4_ * 1.442695;
                      auVar73._0_4_ = (int)auVar64._0_4_;
                      auVar73._4_4_ = (int)auVar64._4_4_;
                      auVar73._8_4_ = (int)auVar64._8_4_;
                      auVar73._12_4_ = (int)auVar64._12_4_;
                      auVar59 = vcvtdq2ps_avx(auVar73);
                      auVar66 = vcmpps_avx(auVar64,auVar59,1);
                      auVar66 = vandps_avx(auVar66,auVar57);
                      auVar66 = vsubps_avx(auVar59,auVar66);
                      fVar31 = auVar66._0_4_ * -0.6931472 + auVar69._0_4_;
                      fVar35 = auVar66._4_4_ * -0.6931472 + auVar69._4_4_;
                      fVar36 = auVar66._8_4_ * -0.6931472 + auVar69._8_4_;
                      fVar37 = auVar66._12_4_ * -0.6931472 + auVar69._12_4_;
                      auVar65._0_4_ = (int)auVar66._0_4_;
                      auVar65._4_4_ = (int)auVar66._4_4_;
                      auVar65._8_4_ = (int)auVar66._8_4_;
                      auVar65._12_4_ = (int)auVar66._12_4_;
                      auVar66 = vpslld_avx(auVar65,0x17);
                      auVar66 = vpaddd_avx(auVar66,auVar57);
                      auVar33._0_4_ =
                           (fVar31 * fVar31 *
                            (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) *
                               fVar31 + 0.041665796) * fVar31 + 0.16666666) * fVar31 + fVar4) +
                           fVar31 + 1.0) * auVar66._0_4_ + 1.0;
                      auVar33._4_4_ =
                           (fVar35 * fVar35 *
                            (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) *
                               fVar35 + 0.041665796) * fVar35 + 0.16666666) * fVar35 + fVar5) +
                           fVar35 + 1.0) * auVar66._4_4_ + 1.0;
                      auVar33._8_4_ =
                           (fVar36 * fVar36 *
                            (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) *
                               fVar36 + 0.041665796) * fVar36 + 0.16666666) * fVar36 + fVar10) +
                           fVar36 + 1.0) * auVar66._8_4_ + 1.0;
                      auVar33._12_4_ =
                           (fVar37 * fVar37 *
                            (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) *
                               fVar37 + 0.041665796) * fVar37 + 0.16666666) * fVar37 + fVar11) +
                           fVar37 + 1.0) * auVar66._12_4_ + 1.0;
                      auVar66 = vrcpps_avx(auVar33);
                      fVar4 = auVar66._0_4_;
                      auVar34._0_4_ = auVar33._0_4_ * fVar4;
                      fVar5 = auVar66._4_4_;
                      auVar34._4_4_ = auVar33._4_4_ * fVar5;
                      fVar10 = auVar66._8_4_;
                      auVar34._8_4_ = auVar33._8_4_ * fVar10;
                      fVar11 = auVar66._12_4_;
                      auVar34._12_4_ = auVar33._12_4_ * fVar11;
                      auVar59 = vsubps_avx(auVar57,auVar34);
                      auVar66._0_4_ = fVar4 + fVar4 * auVar59._0_4_;
                      auVar66._4_4_ = fVar5 + fVar5 * auVar59._4_4_;
                      auVar66._8_4_ = fVar10 + fVar10 * auVar59._8_4_;
                      auVar66._12_4_ = fVar11 + fVar11 * auVar59._12_4_;
                      break;
                    case 5:
                      auVar55._8_4_ = 0x42b0c0a5;
                      auVar55._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar55._12_4_ = 0x42b0c0a5;
                      auVar59 = vminps_avx(auVar66,auVar55);
                      auVar67._8_4_ = 0xc2b0c0a5;
                      auVar67._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar67._12_4_ = 0xc2b0c0a5;
                      auVar38 = vmaxps_avx(auVar67,auVar59);
                      auVar68._0_4_ = auVar38._0_4_ * 1.442695 + fVar4;
                      auVar68._4_4_ = auVar38._4_4_ * 1.442695 + fVar5;
                      auVar68._8_4_ = auVar38._8_4_ * 1.442695 + fVar10;
                      auVar68._12_4_ = auVar38._12_4_ * 1.442695 + fVar11;
                      auVar70._0_4_ = (int)auVar68._0_4_;
                      auVar70._4_4_ = (int)auVar68._4_4_;
                      auVar70._8_4_ = (int)auVar68._8_4_;
                      auVar70._12_4_ = (int)auVar68._12_4_;
                      auVar69 = vcvtdq2ps_avx(auVar70);
                      auVar59 = vcmpps_avx(auVar68,auVar69,1);
                      auVar59 = vandps_avx(auVar59,auVar57);
                      auVar59 = vsubps_avx(auVar69,auVar59);
                      auVar71._0_4_ = auVar59._0_4_ * 0.6931472;
                      auVar71._4_4_ = auVar59._4_4_ * 0.6931472;
                      auVar71._8_4_ = auVar59._8_4_ * 0.6931472;
                      auVar71._12_4_ = auVar59._12_4_ * 0.6931472;
                      auVar69 = vsubps_avx(auVar38,auVar71);
                      fVar37 = auVar69._0_4_;
                      fVar44 = auVar69._4_4_;
                      fVar45 = auVar69._8_4_;
                      fVar46 = auVar69._12_4_;
                      auVar58._0_4_ = (int)auVar59._0_4_;
                      auVar58._4_4_ = (int)auVar59._4_4_;
                      auVar58._8_4_ = (int)auVar59._8_4_;
                      auVar58._12_4_ = (int)auVar59._12_4_;
                      auVar59 = vpslld_avx(auVar58,0x17);
                      auVar59 = vpaddd_avx(auVar59,auVar57);
                      auVar60._0_4_ =
                           (fVar37 + 1.0 +
                           fVar37 * fVar37 *
                           (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) *
                              fVar37 + 0.041665796) * fVar37 + 0.16666666) * fVar37 + fVar4)) *
                           auVar59._0_4_ + 1.0;
                      auVar60._4_4_ =
                           (fVar44 + 1.0 +
                           fVar44 * fVar44 *
                           (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) *
                              fVar44 + 0.041665796) * fVar44 + 0.16666666) * fVar44 + fVar5)) *
                           auVar59._4_4_ + 1.0;
                      auVar60._8_4_ =
                           (fVar45 + 1.0 +
                           fVar45 * fVar45 *
                           (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) *
                              fVar45 + 0.041665796) * fVar45 + 0.16666666) * fVar45 + fVar10)) *
                           auVar59._8_4_ + 1.0;
                      auVar60._12_4_ =
                           (fVar46 + 1.0 +
                           fVar46 * fVar46 *
                           (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) *
                              fVar46 + 0.041665796) * fVar46 + 0.16666666) * fVar46 + fVar11)) *
                           auVar59._12_4_ + 1.0;
                      auVar38._8_4_ = 0x800000;
                      auVar38._0_8_ = 0x80000000800000;
                      auVar38._12_4_ = 0x800000;
                      auVar59 = vmaxps_avx(auVar60,auVar38);
                      auVar69 = vpsrld_avx(auVar59,0x17);
                      auVar47._8_4_ = 0xffffff82;
                      auVar47._0_8_ = 0xffffff82ffffff82;
                      auVar47._12_4_ = 0xffffff82;
                      auVar69 = vpaddd_avx(auVar69,auVar47);
                      auVar48._8_4_ = 0x807fffff;
                      auVar48._0_8_ = 0x807fffff807fffff;
                      auVar48._12_4_ = 0x807fffff;
                      auVar59 = vandps_avx(auVar59,auVar48);
                      auVar39 = vorps_avx(auVar59,auVar30._0_16_);
                      auVar38 = vcvtdq2ps_avx(auVar69);
                      auVar49._8_4_ = 0x3f3504f3;
                      auVar49._0_8_ = 0x3f3504f33f3504f3;
                      auVar49._12_4_ = 0x3f3504f3;
                      auVar69 = vcmpps_avx(auVar39,auVar49,1);
                      auVar59 = vandps_avx(auVar69,auVar39);
                      fVar37 = auVar39._0_4_ + -1.0 + auVar59._0_4_;
                      fVar44 = auVar39._4_4_ + -1.0 + auVar59._4_4_;
                      fVar45 = auVar39._8_4_ + -1.0 + auVar59._8_4_;
                      fVar46 = auVar39._12_4_ + -1.0 + auVar59._12_4_;
                      auVar59 = vandps_avx(auVar69,auVar57);
                      auVar69 = vsubps_avx(auVar38,auVar59);
                      auVar59 = vcmpps_avx(auVar60,_DAT_00554090,2);
                      auVar39._0_4_ =
                           (fVar37 * fVar37 *
                            (((((((((fVar37 * 0.070376836 + -0.1151461) * fVar37 + 0.116769984) *
                                   fVar37 + -0.12420141) * fVar37 + 0.14249323) * fVar37 +
                                -0.16668057) * fVar37 + 0.20000714) * fVar37 + -0.24999994) * fVar37
                             + 0.3333333) * fVar37 + -0.5) + auVar69._0_4_ * 0.6931472 + fVar37) *
                           -2.0;
                      auVar39._4_4_ =
                           (fVar44 * fVar44 *
                            (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) *
                                   fVar44 + -0.12420141) * fVar44 + 0.14249323) * fVar44 +
                                -0.16668057) * fVar44 + 0.20000714) * fVar44 + -0.24999994) * fVar44
                             + 0.3333333) * fVar44 + -0.5) + auVar69._4_4_ * 0.6931472 + fVar44) *
                           -2.0;
                      auVar39._8_4_ =
                           (fVar45 * fVar45 *
                            (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) *
                                   fVar45 + -0.12420141) * fVar45 + 0.14249323) * fVar45 +
                                -0.16668057) * fVar45 + 0.20000714) * fVar45 + -0.24999994) * fVar45
                             + 0.3333333) * fVar45 + -0.5) + auVar69._8_4_ * 0.6931472 + fVar45) *
                           -2.0;
                      auVar39._12_4_ =
                           (fVar46 * fVar46 *
                            (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) *
                                   fVar46 + -0.12420141) * fVar46 + 0.14249323) * fVar46 +
                                -0.16668057) * fVar46 + 0.20000714) * fVar46 + -0.24999994) * fVar46
                             + 0.3333333) * fVar46 + -0.5) + auVar69._12_4_ * 0.6931472 + fVar46) *
                           -2.0;
                      auVar50._8_4_ = 0x7fffffff;
                      auVar50._0_8_ = 0x7fffffff7fffffff;
                      auVar50._12_4_ = 0x7fffffff;
                      auVar59 = vblendvps_avx(auVar39,auVar50,auVar59);
                      auVar51._8_4_ = 0x42b0c0a5;
                      auVar51._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar51._12_4_ = 0x42b0c0a5;
                      auVar59 = vminps_avx(auVar59,auVar51);
                      auVar52._8_4_ = 0xc2b0c0a5;
                      auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar52._12_4_ = 0xc2b0c0a5;
                      auVar38 = vmaxps_avx(auVar59,auVar52);
                      auVar53._0_4_ = auVar38._0_4_ * 1.442695 + fVar4;
                      auVar53._4_4_ = auVar38._4_4_ * 1.442695 + fVar5;
                      auVar53._8_4_ = auVar38._8_4_ * 1.442695 + fVar10;
                      auVar53._12_4_ = auVar38._12_4_ * 1.442695 + fVar11;
                      auVar61._0_4_ = (int)auVar53._0_4_;
                      auVar61._4_4_ = (int)auVar53._4_4_;
                      auVar61._8_4_ = (int)auVar53._8_4_;
                      auVar61._12_4_ = (int)auVar53._12_4_;
                      auVar69 = vcvtdq2ps_avx(auVar61);
                      auVar59 = vcmpps_avx(auVar53,auVar69,1);
                      auVar59 = vandps_avx(auVar59,auVar57);
                      auVar59 = vsubps_avx(auVar69,auVar59);
                      auVar62._0_4_ = auVar59._0_4_ * 0.6931472;
                      auVar62._4_4_ = auVar59._4_4_ * 0.6931472;
                      auVar62._8_4_ = auVar59._8_4_ * 0.6931472;
                      auVar62._12_4_ = auVar59._12_4_ * 0.6931472;
                      auVar69 = vsubps_avx(auVar38,auVar62);
                      fVar37 = auVar69._0_4_;
                      fVar44 = auVar69._4_4_;
                      fVar45 = auVar69._8_4_;
                      fVar46 = auVar69._12_4_;
                      auVar30 = ZEXT1664(auVar30._0_16_);
                      auVar54._0_4_ = (int)auVar59._0_4_;
                      auVar54._4_4_ = (int)auVar59._4_4_;
                      auVar54._8_4_ = (int)auVar59._8_4_;
                      auVar54._12_4_ = (int)auVar59._12_4_;
                      auVar59 = vpslld_avx(auVar54,0x17);
                      auVar59 = vpaddd_avx(auVar59,auVar57);
                      auVar40._0_4_ =
                           (fVar37 + 1.0 +
                           (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) *
                              fVar37 + 0.041665796) * fVar37 + 0.16666666) * fVar37 + fVar4) *
                           fVar37 * fVar37) * auVar59._0_4_ + 1.0;
                      auVar40._4_4_ =
                           (fVar44 + 1.0 +
                           (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) *
                              fVar44 + 0.041665796) * fVar44 + 0.16666666) * fVar44 + fVar5) *
                           fVar44 * fVar44) * auVar59._4_4_ + 1.0;
                      auVar40._8_4_ =
                           (fVar45 + 1.0 +
                           (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) *
                              fVar45 + 0.041665796) * fVar45 + 0.16666666) * fVar45 + fVar10) *
                           fVar45 * fVar45) * auVar59._8_4_ + 1.0;
                      auVar40._12_4_ =
                           (fVar46 + 1.0 +
                           (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) *
                              fVar46 + 0.041665796) * fVar46 + 0.16666666) * fVar46 + fVar11) *
                           fVar46 * fVar46) * auVar59._12_4_ + 1.0;
                      auVar59 = vrcpps_avx(auVar40);
                      fVar4 = auVar59._0_4_;
                      fVar5 = auVar59._4_4_;
                      fVar10 = auVar59._8_4_;
                      fVar11 = auVar59._12_4_;
                      auVar41._0_4_ = auVar40._0_4_ * (fVar4 + fVar4);
                      auVar41._4_4_ = auVar40._4_4_ * (fVar5 + fVar5);
                      auVar41._8_4_ = auVar40._8_4_ * (fVar10 + fVar10);
                      auVar41._12_4_ = auVar40._12_4_ * (fVar11 + fVar11);
                      auVar56._8_4_ = 0x40000000;
                      auVar56._0_8_ = 0x4000000040000000;
                      auVar56._12_4_ = 0x40000000;
                      auVar69 = vsubps_avx(auVar56,auVar41);
                      auVar59._0_4_ = fVar4 + fVar4 + -1.0 + fVar4 * auVar69._0_4_;
                      auVar59._4_4_ = fVar5 + fVar5 + -1.0 + fVar5 * auVar69._4_4_;
                      auVar59._8_4_ = fVar10 + fVar10 + -1.0 + fVar10 * auVar69._8_4_;
                      auVar59._12_4_ = fVar11 + fVar11 + -1.0 + fVar11 * auVar69._12_4_;
                      goto LAB_003eb3a6;
                    case 6:
                      fVar4 = **(float **)(&this->field_0x118 + (long)p_Var19);
                      fVar5 = (*(float **)(&this->field_0x118 + (long)p_Var19))[1];
                      auVar69._0_4_ = fVar4 * auVar66._0_4_ + fVar5;
                      auVar69._4_4_ = fVar4 * fVar31 + fVar5;
                      auVar69._8_4_ = fVar4 * fVar35 + fVar5;
                      auVar69._12_4_ = fVar4 * fVar36 + fVar5;
                      auVar59 = vmaxps_avx(auVar69,_DAT_00554090);
                      auVar59 = vminps_avx(auVar59,auVar57);
LAB_003eb3a6:
                      auVar66._0_4_ = auVar59._0_4_ * auVar66._0_4_;
                      auVar66._4_4_ = auVar59._4_4_ * fVar31;
                      auVar66._8_4_ = auVar59._8_4_ * fVar35;
                      auVar66._12_4_ = auVar59._12_4_ * fVar36;
                    }
                    *(undefined1 (*) [16])((long)pvVar27 + uVar24 * 0x10) = auVar66;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != _w);
                }
                pvVar27 = (void *)((long)pvVar27 + (long)(int)(_w * 4) * 4);
                bVar28 = iVar17 != iVar25;
                iVar17 = iVar17 + 1;
              } while (bVar28);
            }
            local_210 = local_210 + 1;
            iVar13 = iVar13 + local_15c;
          } while (local_210 != uVar15);
        }
      }
      else {
        if (iVar13 != 8) goto LAB_003ea7b2;
        iVar13 = *(int *)(&this->field_0xd4 + (long)p_Var19);
        iVar17 = *(int *)(&this->field_0xd8 + (long)p_Var19);
        if (iVar13 == 5) {
          if (iVar17 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var19) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var19) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var19) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var19) == 1)))) {
              convdw5x5s1_pack8_avx
                        (&local_1a8,top_blob,&this->weight_data_tm,
                         *(Mat **)(&this->field_0x1b0 + (long)p_Var19),opt_00);
            }
            else {
              iVar17 = 5;
              if (((*(int *)(&this->field_0xdc + (long)p_Var19) != 1) ||
                  (*(int *)(&this->field_0xe0 + (long)p_Var19) != 1)) ||
                 ((*(int *)(&this->field_0xe4 + (long)p_Var19) != 2 ||
                  (*(int *)(&this->field_0xe8 + (long)p_Var19) != 2)))) goto LAB_003eb4ce;
              convdw5x5s2_pack8_avx
                        (&local_1a8,top_blob,&this->weight_data_tm,
                         *(Mat **)(&this->field_0x1b0 + (long)p_Var19),opt_00);
            }
            goto LAB_003eb4b0;
          }
        }
        else if ((iVar13 == 3) && (iVar17 == 3)) {
          if ((*(int *)(&this->field_0xdc + (long)p_Var19) == 1) &&
             (((*(int *)(&this->field_0xe0 + (long)p_Var19) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var19) == 1)) &&
              (*(int *)(&this->field_0xe8 + (long)p_Var19) == 1)))) {
            convdw3x3s1_pack8_avx
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var19),opt_00);
          }
          else {
            iVar17 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var19) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var19) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var19) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var19) != 2)) goto LAB_003eb4ce;
            convdw3x3s2_pack8_avx
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var19),opt_00);
          }
          goto LAB_003eb4b0;
        }
LAB_003eb4ce:
        uVar26 = iVar17 * iVar13;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar26,
                   (allocator_type *)&local_1f8);
        pp_Var16 = this->_vptr_ConvolutionDepthWise_x86_avx;
        p_Var19 = pp_Var16[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var19)) {
          iVar13 = *(int *)(&this->field_0xe0 + (long)p_Var19);
          iVar17 = *(int *)(&this->field_0xdc + (long)p_Var19);
          iVar6 = *(int *)(&this->field_0xd4 + (long)p_Var19);
          iVar14 = 0;
          iVar20 = 0;
          iVar21 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var19)) {
              lVar23 = 0;
              do {
                *(int *)((long)(_func_int ***)local_158.data + lVar23 * 4 + (long)iVar14 * 4) =
                     iVar20;
                p_Var19 = pp_Var16[-3];
                iVar20 = iVar20 + *(int *)(&this->field_0xdc + (long)p_Var19);
                lVar23 = lVar23 + 1;
              } while ((int)lVar23 < *(int *)(&this->field_0xd4 + (long)p_Var19));
              iVar14 = iVar14 + (int)lVar23;
            }
            iVar20 = iVar20 + (iVar12 * iVar13 - iVar17 * iVar6);
            iVar21 = iVar21 + 1;
          } while (iVar21 < *(int *)(&this->field_0xd8 + (long)p_Var19));
        }
        if (0 < (int)uVar15) {
          iVar13 = 0;
          local_248 = 0;
          do {
            if (-1 < iVar25) {
              pvVar27 = (void *)(top_blob->cstep * local_248 * top_blob->elemsize +
                                (long)top_blob->data);
              pp_Var16 = this->_vptr_ConvolutionDepthWise_x86_avx;
              pvVar9 = (this->weight_data_tm).data;
              iVar17 = 0;
              do {
                if (-1 < iVar18) {
                  uVar24 = 0;
                  do {
                    p_Var19 = pp_Var16[-3];
                    if (*(int *)(&this->field_0x100 + (long)p_Var19) == 0) {
                      auVar30 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    else {
                      auVar30 = ZEXT3264(*(undefined1 (*) [32])
                                          (*(long *)(&this->field_0x1b0 + (long)p_Var19) +
                                          local_248 * 0x20));
                    }
                    auVar29 = auVar30._0_32_;
                    if (0 < (int)uVar26) {
                      lVar23 = 0;
                      do {
                        pfVar2 = (float *)((long)pvVar9 + lVar23 * 8 + (long)iVar13 * 4);
                        pfVar1 = (float *)((long)&((Allocator *)
                                                  ((long)local_1a8.data +
                                                  (long)*(int *)((long)(_func_int ***)local_158.data
                                                                + lVar23) * 4 * 8))->_vptr_Allocator
                                          + (long)(*(int *)(&this->field_0xe4 + (long)p_Var19) *
                                                   (int)uVar24 * 8) * 4 +
                                            (long)*(int *)(&this->field_0xe8 + (long)p_Var19) *
                                            (long)iVar17 * (long)local_1a8.w * local_1a8.elemsize +
                                            local_1a8.cstep * local_248 * local_1a8.elemsize);
                        auVar29._0_4_ = *pfVar2 * *pfVar1 + auVar30._0_4_;
                        auVar29._4_4_ = pfVar2[1] * pfVar1[1] + auVar30._4_4_;
                        auVar29._8_4_ = pfVar2[2] * pfVar1[2] + auVar30._8_4_;
                        auVar29._12_4_ = pfVar2[3] * pfVar1[3] + auVar30._12_4_;
                        auVar29._16_4_ = pfVar2[4] * pfVar1[4] + auVar30._16_4_;
                        auVar29._20_4_ = pfVar2[5] * pfVar1[5] + auVar30._20_4_;
                        auVar29._24_4_ = pfVar2[6] * pfVar1[6] + auVar30._24_4_;
                        auVar29._28_4_ = pfVar2[7] + auVar30._28_4_;
                        auVar30 = ZEXT3264(auVar29);
                        lVar23 = lVar23 + 4;
                      } while ((ulong)uVar26 << 2 != lVar23);
                    }
                    *(undefined1 (*) [32])((long)pvVar27 + uVar24 * 0x20) = auVar29;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != _w);
                }
                pvVar27 = (void *)((long)pvVar27 + (long)(int)(_w * 8) * 4);
                bVar28 = iVar17 != iVar25;
                iVar17 = iVar17 + 1;
              } while (bVar28);
            }
            local_248 = local_248 + 1;
            iVar13 = iVar13 + uVar26 * 8;
          } while (local_248 != uVar15);
        }
        pLVar8 = this->activation;
        if (pLVar8 != (Layer *)0x0) {
          (*pLVar8->_vptr_Layer[9])(pLVar8,top_blob,opt);
        }
      }
      if ((Allocator *)local_158.data != (Allocator *)0x0) {
        operator_delete(local_158.data,local_158.elemsize - (long)local_158.data);
      }
    }
    iVar14 = 0;
    goto LAB_003eb835;
  }
LAB_003ea7b2:
  uVar15 = iVar14 / iVar6;
  uVar26 = iVar17 / iVar6;
  iVar18 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar18 = (uint)((uVar15 & 3) == 0) * 3 + 1;
    if ((uVar15 & 7) == 0) {
      iVar18 = 8;
    }
    _elempack = (uint)((uVar26 & 3) == 0) * 3 + 1;
    if ((uVar26 & 7) == 0) {
      _elempack = 8;
    }
  }
  piVar7 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  local_158.refcount = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  local_158.data = local_1a8.data;
  local_158.elemsize = local_1a8.elemsize;
  local_158.elempack = local_1a8.elempack;
  local_158.allocator = local_1a8.allocator;
  local_158.w = local_1a8.w;
  local_158.dims = local_1a8.dims;
  local_158.d = local_1a8.d;
  local_158.h = local_1a8.h;
  local_158.c = local_1a8.c;
  local_158.cstep = local_1a8.cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  if (iVar18 < iVar13) {
    local_1f8.data = *(void **)opt;
    local_1f8.elemsize = (size_t)opt->workspace_allocator;
    local_1f8.elempack = opt->openmp_blocktime;
    local_1f8._28_1_ = opt->use_winograd_convolution;
    local_1f8._29_1_ = opt->use_sgemm_convolution;
    local_1f8._30_1_ = opt->use_int8_inference;
    local_1f8._31_1_ = opt->use_vulkan_compute;
    local_1f8.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_1f8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_1f8._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_1f8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
    local_1f8.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_1a8,&local_158,iVar18,(Option *)&local_1f8);
  }
  piVar7 = top_blob->refcount;
  local_1f8.data = top_blob->data;
  local_1f8.refcount = top_blob->refcount;
  local_1f8.elemsize = top_blob->elemsize;
  local_1f8.elempack = top_blob->elempack;
  local_1f8.allocator = top_blob->allocator;
  local_1f8.dims = top_blob->dims;
  local_1f8.w = top_blob->w;
  local_1f8.h = top_blob->h;
  local_1f8.d = top_blob->d;
  local_1f8.c = top_blob->c;
  local_1f8.cstep = top_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  pp_Var16 = this->_vptr_ConvolutionDepthWise_x86_avx;
  if (_elempack < _elempack_00) {
    Mat::create(&local_1f8,_w,iVar25 + 1,
                *(int *)(&this->field_0xd0 + (long)pp_Var16[-3]) / (int)_elempack,
                (ulong)_elempack * (_elemsize / uVar22),_elempack,opt->workspace_allocator);
    iVar14 = -100;
    if ((local_1f8.data != (void *)0x0) && ((long)local_1f8.c * local_1f8.cstep != 0)) {
      pp_Var16 = this->_vptr_ConvolutionDepthWise_x86_avx;
      goto LAB_003ea9a9;
    }
  }
  else {
LAB_003ea9a9:
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var16[-3])) {
      iVar25 = 0;
      iVar13 = 0;
      lVar23 = 0;
      do {
        local_c0 = (_func_int ***)
                   ((long)(_func_int ***)local_158.data +
                   (long)(iVar25 / iVar18) * local_158.cstep * local_158.elemsize);
        local_b8 = (int *)0x0;
        local_b0 = local_158.elemsize;
        local_a8 = local_158.elempack;
        local_a0 = local_158.allocator;
        local_80 = ((long)local_158.d * local_158.elemsize * (long)local_158.h * (long)local_158.w +
                    0xf & 0xfffffffffffffff0) / local_158.elemsize;
        local_98 = local_158.dims;
        iStack_94 = local_158.w;
        iStack_90 = local_158.h;
        iStack_8c = local_158.d;
        local_108 = (void *)((long)(iVar13 / (int)_elempack) * local_1f8.cstep * local_1f8.elemsize
                            + (long)local_1f8.data);
        local_100 = (int *)0x0;
        local_f8 = local_1f8.elemsize;
        local_f0 = local_1f8.elempack;
        local_e8 = local_1f8.allocator;
        local_c8 = ((long)local_1f8.d * local_1f8.elemsize * (long)local_1f8.h * (long)local_1f8.w +
                    0xf & 0xfffffffffffffff0) / local_1f8.elemsize;
        local_e0 = local_1f8.dims;
        iStack_dc = local_1f8.w;
        iStack_d8 = local_1f8.h;
        iStack_d4 = local_1f8.d;
        pLVar8 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar23];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_reserved_0;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_shader_local_memory;
        uStack_48._6_1_ = opt->use_cooperative_matrix;
        uStack_48._7_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = local_1f8.allocator;
        local_d0 = (int)uVar26 / (int)_elempack;
        local_88 = (int)uVar15 / iVar18;
        (*pLVar8->_vptr_Layer[7])(pLVar8,&local_c0,&local_108);
        if (local_100 != (int *)0x0) {
          LOCK();
          *local_100 = *local_100 + -1;
          UNLOCK();
          if (*local_100 == 0) {
            if (local_e8 == (Allocator *)0x0) {
              if (local_108 != (void *)0x0) {
                free(local_108);
              }
            }
            else {
              (*local_e8->_vptr_Allocator[3])();
            }
          }
        }
        if (local_b8 != (int *)0x0) {
          LOCK();
          *local_b8 = *local_b8 + -1;
          UNLOCK();
          if (*local_b8 == 0) {
            if (local_a0 == (Allocator *)0x0) {
              if (local_c0 != (_func_int ***)0x0) {
                free(local_c0);
              }
            }
            else {
              (*local_a0->_vptr_Allocator[3])();
            }
          }
        }
        lVar23 = lVar23 + 1;
        iVar13 = iVar13 + uVar26;
        iVar25 = iVar25 + uVar15;
      } while (lVar23 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
    }
    if (_elempack < _elempack_00) {
      convert_packing(&local_1f8,top_blob,_elempack_00,opt);
      iVar14 = 0;
    }
    else {
      iVar14 = 0;
      if (&local_1f8 != top_blob) {
        if (local_1f8.refcount != (int *)0x0) {
          LOCK();
          *local_1f8.refcount = *local_1f8.refcount + 1;
          UNLOCK();
        }
        piVar7 = top_blob->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar14 = 0;
        top_blob->data = local_1f8.data;
        top_blob->refcount = local_1f8.refcount;
        top_blob->elemsize = local_1f8.elemsize;
        top_blob->elempack = local_1f8.elempack;
        top_blob->allocator = local_1f8.allocator;
        top_blob->dims = local_1f8.dims;
        top_blob->w = local_1f8.w;
        top_blob->h = local_1f8.h;
        top_blob->d = local_1f8.d;
        top_blob->c = local_1f8.c;
        top_blob->cstep = local_1f8.cstep;
      }
    }
  }
  if (local_1f8.refcount != (int *)0x0) {
    LOCK();
    *local_1f8.refcount = *local_1f8.refcount + -1;
    UNLOCK();
    if (*local_1f8.refcount == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if (local_1f8.data != (void *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_158.refcount != (int *)0x0) {
    LOCK();
    *local_158.refcount = *local_158.refcount + -1;
    UNLOCK();
    if (*local_158.refcount == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_158.data != (Allocator *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003eb835:
  piVar7 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar14;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}